

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpushbutton.cpp
# Opt level: O3

void __thiscall QPushButton::setDefault(QPushButton *this,bool enable)

{
  QPushButtonPrivate *this_00;
  QDialog *pQVar1;
  long in_FS_OFFSET;
  code *local_40;
  undefined8 local_38;
  QPushButton *pQStack_30;
  undefined8 local_28;
  undefined8 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPushButtonPrivate **)&(this->super_QAbstractButton).super_QWidget.field_0x8;
  if (((this_00->field_0x2c8 & 4) == 0) == enable) {
    this_00->field_0x2c8 = this_00->field_0x2c8 & 0xfb | enable * '\x04';
    if (enable) {
      pQVar1 = QPushButtonPrivate::dialogParent(this_00);
      if (pQVar1 != (QDialog *)0x0) {
        QDialogPrivate::setMainDefault(*(QDialogPrivate **)&(pQVar1->super_QWidget).field_0x8,this);
      }
    }
    QWidget::update((QWidget *)this);
    local_28 = 0xaaaaaaaaffffffff;
    local_40 = QCss::ValueExtractor::extractGeometry;
    local_20 = 0x400;
    local_38 = 0xaaaaaaaa0000800a;
    pQStack_30 = this;
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_40);
    QAccessibleStateChangeEvent::~QAccessibleStateChangeEvent
              ((QAccessibleStateChangeEvent *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPushButton::setDefault(bool enable)
{
    Q_D(QPushButton);
    if (d->defaultButton == enable)
        return;
    d->defaultButton = enable;
#if QT_CONFIG(dialog)
    if (d->defaultButton) {
        if (QDialog *dlg = d->dialogParent())
            dlg->d_func()->setMainDefault(this);
    }
#endif
    update();
#if QT_CONFIG(accessibility)
    QAccessible::State s;
    s.defaultButton = true;
    QAccessibleStateChangeEvent event(this, s);
    QAccessible::updateAccessibility(&event);
#endif
}